

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O1

DdNode * Cudd_addTimes(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  
  pDVar2 = *f;
  pDVar1 = *g;
  pDVar3 = dd->zero;
  if (pDVar1 != pDVar3 && pDVar2 != pDVar3) {
    if (pDVar2 == dd->one) {
      return pDVar1;
    }
    if (pDVar1 == dd->one) {
      return pDVar2;
    }
    if ((pDVar2->index == 0x7fffffff) && (pDVar1->index == 0x7fffffff)) {
      pDVar2 = cuddUniqueConst(dd,(pDVar2->type).value * (pDVar1->type).value);
      return pDVar2;
    }
    if (pDVar1 < pDVar2) {
      *f = pDVar1;
      *g = pDVar2;
    }
    pDVar3 = (DdNode *)0x0;
  }
  return pDVar3;
}

Assistant:

DdNode *
Cudd_addTimes(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *res;
    DdNode *F, *G;
    CUDD_VALUE_TYPE value;

    F = *f; G = *g;
    if (F == DD_ZERO(dd) || G == DD_ZERO(dd)) return(DD_ZERO(dd));
    if (F == DD_ONE(dd)) return(G);
    if (G == DD_ONE(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        value = cuddV(F)*cuddV(G);
        res = cuddUniqueConst(dd,value);
        return(res);
    }
    if (F > G) { /* swap f and g */
        *f = G;
        *g = F;
    }
    return(NULL);

}